

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_32(QPDF *pdf,char *arg2)

{
  ostream *poVar1;
  undefined8 *puVar2;
  char *pcVar3;
  bool bVar4;
  ulong uVar5;
  allocator<char> local_69;
  QPDF *local_68;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  string local_50 [32];
  
  puVar2 = &DAT_0014f760;
  local_68 = pdf;
  for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
    pcVar3 = (char *)*puVar2;
    QPDFWriter::QPDFWriter(&w,local_68,pcVar3);
    bVar4 = SUB81(&w,0);
    QPDFWriter::setStaticID(bVar4);
    poVar1 = std::operator<<((ostream *)&std::cout,"file: ");
    poVar1 = std::operator<<(poVar1,pcVar3);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,"linearized: ");
    pcVar3 = "no";
    if ((uVar5 & 1) != 0) {
      pcVar3 = "yes";
    }
    poVar1 = std::operator<<(poVar1,pcVar3);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,"newline: ");
    pcVar3 = "yes";
    if (uVar5 < 2) {
      pcVar3 = "no";
    }
    poVar1 = std::operator<<(poVar1,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar1);
    QPDFWriter::setLinearization(bVar4);
    if ((uVar5 & 1) != 0) {
      QPDFWriter::setCompressStreams(bVar4);
    }
    pcVar3 = "%% Comment with newline\n";
    if (uVar5 < 2) {
      pcVar3 = "%% Comment\n% No newline";
    }
    std::__cxx11::string::string<std::allocator<char>>(local_50,pcVar3,&local_69);
    QPDFWriter::setExtraHeaderText((string *)&w);
    std::__cxx11::string::~string(local_50);
    QPDFWriter::write();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
    puVar2 = puVar2 + 1;
  }
  return;
}

Assistant:

static void
test_32(QPDF& pdf, char const* arg2)
{
    // Extra header text
    char const* filenames[] = {"a.pdf", "b.pdf", "c.pdf", "d.pdf"};
    for (int i = 0; i < 4; ++i) {
        bool linearized = ((i & 1) != 0);
        bool newline = ((i & 2) != 0);
        QPDFWriter w(pdf, filenames[i]);
        w.setStaticID(true);
        std::cout << "file: " << filenames[i] << std::endl
                  << "linearized: " << (linearized ? "yes" : "no") << std::endl
                  << "newline: " << (newline ? "yes" : "no") << std::endl;
        w.setLinearization(linearized);
        if (linearized) {
            w.setCompressStreams(false); // avoid dependency on zlib's output
        }
        w.setExtraHeaderText(newline ? "%% Comment with newline\n" : "%% Comment\n% No newline");
        w.write();
    }
}